

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

void __thiscall
pbrt::BSDF::BSDF(BSDF *this,Vector3f *wo,Normal3f *n,Normal3f *ns,Vector3f *dpdus,BxDFHandle *bxdf,
                Float eta)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).z;
  fVar9 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar13 = ZEXT416((uint)(fVar1 * fVar9));
  auVar10 = vfmadd132ss_fma(ZEXT416((uint)(n->super_Tuple3<pbrt::Normal3,_float>).y),auVar13,
                            ZEXT416((uint)(wo->super_Tuple3<pbrt::Vector3,_float>).y));
  auVar13 = vfmsub213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar1),auVar13);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ + auVar13._0_4_)),
                            ZEXT416((uint)(n->super_Tuple3<pbrt::Normal3,_float>).x),
                            ZEXT416((uint)(wo->super_Tuple3<pbrt::Vector3,_float>).x));
  uVar4 = vcmpss_avx512f(auVar10,ZEXT816(0),1);
  bVar5 = (bool)((byte)uVar4 & 1);
  this->eta = (Float)((uint)bVar5 * (int)(1.0 / eta) + (uint)!bVar5 * (int)eta);
  (this->bxdf).
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = 0;
  (this->bxdf).
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (bxdf->
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          ).bits;
  uVar2._0_4_ = (dpdus->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar2._4_4_ = (dpdus->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar2;
  fVar1 = (dpdus->super_Tuple3<pbrt::Vector3,_float>).z;
  uVar3._0_4_ = (ns->super_Tuple3<pbrt::Normal3,_float>).x;
  uVar3._4_4_ = (ns->super_Tuple3<pbrt::Normal3,_float>).y;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar3;
  auVar10._0_4_ = (float)(undefined4)uVar2 * (float)(undefined4)uVar2;
  auVar10._4_4_ = (float)uVar2._4_4_ * (float)uVar2._4_4_;
  auVar10._8_8_ = 0;
  auVar13 = vmovshdup_avx(auVar14);
  auVar10 = vmovshdup_avx(auVar10);
  auVar10 = vfmadd231ss_fma(auVar10,auVar8,auVar8);
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
  auVar10 = vsqrtss_avx(auVar10,auVar10);
  fVar9 = auVar10._0_4_;
  auVar11._4_4_ = fVar9;
  auVar11._0_4_ = fVar9;
  auVar11._8_4_ = fVar9;
  auVar11._12_4_ = fVar9;
  auVar7._0_4_ = fVar1 / fVar9;
  auVar7._4_12_ = SUB6012((undefined1  [60])0x0,0);
  fVar1 = (ns->super_Tuple3<pbrt::Normal3,_float>).z;
  auVar10 = vdivps_avx(auVar8,auVar11);
  auVar8 = vmovshdup_avx(auVar10);
  uVar4 = vmovlps_avx(auVar10);
  (this->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar4;
  (this->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar4 >> 0x20);
  (this->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = auVar7._0_4_;
  auVar15 = ZEXT416((uint)(auVar13._0_4_ * auVar10._0_4_));
  auVar11 = vfmsub213ss_fma(auVar8,auVar14,auVar15);
  auVar12 = ZEXT416((uint)(fVar1 * auVar8._0_4_));
  auVar6 = vfnmadd213ss_fma(auVar8,ZEXT416((uint)fVar1),auVar12);
  auVar8 = vfmsub231ss_fma(auVar12,auVar13,auVar7);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar10,auVar15);
  auVar10 = vfmsub213ss_fma(auVar10,ZEXT416((uint)fVar1),
                            ZEXT416((uint)((float)(undefined4)uVar3 * auVar7._0_4_)));
  auVar7 = vfnmadd231ss_fma(ZEXT416((uint)((float)(undefined4)uVar3 * auVar7._0_4_)),auVar14,auVar7)
  ;
  auVar10 = vinsertps_avx(ZEXT416((uint)(auVar8._0_4_ + auVar6._0_4_)),
                          ZEXT416((uint)(auVar7._0_4_ + auVar10._0_4_)),0x10);
  uVar4 = vmovlps_avx(auVar10);
  (this->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar4;
  (this->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar4 >> 0x20);
  (this->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.z = auVar11._0_4_ + auVar13._0_4_;
  (this->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)uVar3;
  (this->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar3._4_4_;
  (this->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = fVar1;
  fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).y;
  (this->ng).super_Tuple3<pbrt::Normal3,_float>.x = (n->super_Tuple3<pbrt::Normal3,_float>).x;
  (this->ng).super_Tuple3<pbrt::Normal3,_float>.y = fVar1;
  (this->ng).super_Tuple3<pbrt::Normal3,_float>.z = (n->super_Tuple3<pbrt::Normal3,_float>).z;
  return;
}

Assistant:

PBRT_CPU_GPU inline auto Dot(const Vector3<T> &v, const Normal3<T> &n) ->
    typename TupleLength<T>::type {
    DCHECK(!v.HasNaN() && !n.HasNaN());
    return FMA(n.x, v.x, SumOfProducts(n.y, v.y, n.z, v.z));
}